

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-stm.c
# Opt level: O1

int ldeletereader(lua_State *L)

{
  int *piVar1;
  int *__ptr;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)lua_touserdata(L,1);
  __ptr = (int *)*puVar2;
  while( true ) {
    do {
    } while (*__ptr != 0);
    LOCK();
    __ptr[1] = __ptr[1] + 1;
    UNLOCK();
    if (*__ptr == 0) break;
    LOCK();
    __ptr[1] = __ptr[1] + -1;
    UNLOCK();
  }
  LOCK();
  piVar1 = __ptr + 2;
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  if (*piVar1 == 0) {
    if (*(long *)(__ptr + 4) != 0) {
      __assert_fail("obj->copy == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/lualib-src/lua-stm.c"
                    ,0x4c,"void stm_releasereader(struct stm_object *)");
    }
    free(__ptr);
  }
  else {
    LOCK();
    __ptr[1] = __ptr[1] + -1;
    UNLOCK();
  }
  *puVar2 = 0;
  stm_releasecopy((stm_copy *)puVar2[1]);
  puVar2[1] = 0;
  return 0;
}

Assistant:

static int
ldeletereader(lua_State *L) {
	struct boxreader * box = lua_touserdata(L, 1);
	stm_releasereader(box->obj);
	box->obj = NULL;
	stm_releasecopy(box->lastcopy);
	box->lastcopy = NULL;

	return 0;
}